

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiger.cpp
# Opt level: O1

void __thiscall despot::Tiger::PrintAction(Tiger *this,ACT_TYPE action,ostream *out)

{
  long lVar1;
  char *pcVar2;
  
  if (action == 1) {
    pcVar2 = "Open right";
    lVar1 = 10;
  }
  else if (action == 0) {
    pcVar2 = "Open left";
    lVar1 = 9;
  }
  else {
    pcVar2 = "Listen";
    lVar1 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Tiger::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		out << "Open left" << endl;
	} else if (action == RIGHT) {
		out << "Open right" << endl;
	} else {
		out << "Listen" << endl;
	}
}